

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::ClearAllHighlights(BoardView *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  element_type *peVar3;
  BoardView *in_RDI;
  shared_ptr<Component> part;
  iterator __end2;
  iterator __begin2;
  SharedVector<Component> *__range2;
  BoardView *in_stack_ffffffffffffffc0;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_28;
  undefined8 local_20;
  
  std::shared_ptr<Pin>::shared_ptr((shared_ptr<Pin> *)in_stack_ffffffffffffffc0,in_RDI);
  std::shared_ptr<Pin>::operator=
            ((shared_ptr<Pin> *)in_stack_ffffffffffffffc0,(shared_ptr<Pin> *)in_RDI);
  std::shared_ptr<Pin>::~shared_ptr((shared_ptr<Pin> *)0x1212cf);
  FindNet(in_stack_ffffffffffffffc0,(char *)in_RDI);
  FindComponent(in_stack_ffffffffffffffc0,(char *)in_RDI);
  ResetSearch(in_RDI);
  in_RDI->m_needsRedraw = true;
  if (in_RDI->m_board != (Board *)0x0) {
    iVar2 = (*in_RDI->m_board->_vptr_Board[3])();
    local_20 = CONCAT44(extraout_var,iVar2);
    local_28._M_current =
         (shared_ptr<Component> *)
         std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
         begin((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               in_RDI);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::end
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               in_RDI);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                               *)in_stack_ffffffffffffffc0,
                              (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                               *)in_RDI), bVar1) {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
      ::operator*(&local_28);
      std::shared_ptr<Component>::shared_ptr
                ((shared_ptr<Component> *)in_stack_ffffffffffffffc0,(shared_ptr<Component> *)in_RDI)
      ;
      std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x121375);
      peVar3 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x12137f);
      peVar3->visualmode = '\0';
      std::shared_ptr<Component>::~shared_ptr((shared_ptr<Component> *)0x121390);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
      ::operator++(&local_28);
    }
  }
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
            ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
             0x1213ae);
  std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
            ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)0x1213be);
  return;
}

Assistant:

void BoardView::ClearAllHighlights(void) {
	m_pinSelected = nullptr;
	FindNet("");
	FindComponent("");
	ResetSearch();
	m_needsRedraw      = true;
	if (m_board != NULL) {
		for (auto part : m_board->Components()) part->visualmode = part->CVMNormal;
	}
	m_partHighlighted.clear();
	m_pinHighlighted.clear();
}